

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O1

void btvv(void)

{
  int iVar1;
  FX *fx_addr68k;
  
  fx_addr68k = (FX *)(MachineState.pvar + -10);
  while( true ) {
    iVar1 = get_framename(fx_addr68k);
    if ((iVar1 == 0x4c) || (fx_addr68k->alink == 0xb)) break;
    sf(fx_addr68k);
    fx_addr68k = get_nextFX(fx_addr68k);
  }
  sf(fx_addr68k);
  puts("\n BTV! end ********");
  return;
}

Assistant:

void btvv(void) {
  struct frameex1 *fx_addr68k;
  LispPTR atomindex;
  FX *get_nextFX(FX * fx);

  fx_addr68k = CURRENTFX;

  atomindex = get_framename(fx_addr68k);

  while ((atomindex != ATOM_T) && (fx_addr68k->alink != 11)) {
    sf(fx_addr68k);
    fx_addr68k = get_nextFX(fx_addr68k);
    atomindex = get_framename(fx_addr68k);
  }

  sf(fx_addr68k);

  printf("\n BTV! end ********\n");

}